

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_AActor_A_Overlay(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int layer;
  player_t *this;
  bool bVar1;
  PClassActor *pPVar2;
  FState *newstate;
  DPSprite *pDVar3;
  int iVar4;
  char *pcVar5;
  AActor *caller;
  DObject *this_00;
  
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_0043d213:
      pcVar5 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0043d22c;
    }
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) goto LAB_0043d033;
      bVar1 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
      if (!bVar1) {
        pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0043d22c;
      }
    }
    else {
      if (this_00 != (DObject *)0x0) goto LAB_0043d213;
LAB_0043d033:
      this_00 = (DObject *)0x0;
    }
    if (numparam != 1) {
      if (param[1].field_0.field_3.Type != '\x03') goto LAB_0043d213;
      caller = (AActor *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (caller == (AActor *)0x0) goto LAB_0043d088;
        bVar1 = DObject::IsKindOf((DObject *)caller,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043d22c;
        }
      }
      else {
        if (caller != (AActor *)0x0) goto LAB_0043d213;
LAB_0043d088:
        caller = (AActor *)0x0;
      }
      if (2 < (uint)numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar5 = "(paramnum) < numparam";
LAB_0043d254:
            __assert_fail(pcVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                          ,0x51a,
                          "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (param[3].field_0.field_3.Type != '\0') {
            pcVar5 = "param[paramnum].Type == REGT_INT";
            goto LAB_0043d254;
          }
          layer = param[3].field_0.i;
          if ((uint)numparam < 5) {
            if (defaultparam->Array[4].field_0.field_3.Type != '\0') {
              pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_0043d27c;
            }
            iVar4 = defaultparam->Array[4].field_0.i;
            pPVar2 = (PClassActor *)DObject::GetClass((DObject *)caller);
            newstate = FStateLabelStorage::GetState(&StateLabels,iVar4,pPVar2,false);
          }
          else {
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_0043d27c:
              __assert_fail(pcVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x51b,
                            "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar4 = param[4].field_0.i;
            pPVar2 = (PClassActor *)DObject::GetClass((DObject *)caller);
            newstate = FStateLabelStorage::GetState(&StateLabels,iVar4,pPVar2,false);
            if (numparam != 5) {
              if (param[5].field_0.field_3.Type != '\0') {
                pcVar5 = "(param[paramnum]).Type == REGT_INT";
                goto LAB_0043d29b;
              }
              goto LAB_0043d15c;
            }
          }
          param = defaultparam->Array;
          if (param[5].field_0.field_3.Type != '\0') {
            pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0043d29b:
            __assert_fail(pcVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                          ,0x51c,
                          "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
LAB_0043d15c:
          this = (player_t *)this_00[0xe]._vptr_DObject;
          iVar4 = 1;
          if ((this == (player_t *)0x0) ||
             ((param[5].field_0.i != 0 &&
              (pDVar3 = player_t::FindPSprite(this,layer), pDVar3 != (DPSprite *)0x0)))) {
            if (numret < 1) {
              return 0;
            }
            iVar4 = 0;
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x522,
                            "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            pDVar3 = (DPSprite *)DObject::operator_new(0x88);
            DPSprite::DPSprite(pDVar3,this,caller,layer);
            DPSprite::SetState(pDVar3,newstate,false);
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x528,
                            "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          VMReturn::SetInt(ret,iVar4);
          return 1;
        }
        pcVar5 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_0043d22c;
      }
    }
  }
  pcVar5 = "(paramnum) < numparam";
LAB_0043d22c:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                ,0x519,"int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT		(layer);
	PARAM_STATE_ACTION_DEF(state);
	PARAM_BOOL_DEF(dontoverride);

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}